

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.h
# Opt level: O1

bool __thiscall asl::String::equalsNocase(String *this,String *s)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  Enumerator e2;
  Enumerator e1;
  Enumerator local_48;
  Enumerator local_38;
  
  if (this->_size == 0) {
    local_38.u = (char *)&this->field_2;
  }
  else {
    local_38.u = (this->field_2)._str;
  }
  local_38.n = 1;
  if (s->_size == 0) {
    local_48.u = (char *)&s->field_2;
  }
  else {
    local_48.u = (s->field_2)._str;
  }
  local_48.n = 1;
  bVar3 = *local_38.u == '\0';
  if (!bVar3) {
    if (*local_48.u != '\0') {
      do {
        iVar1 = Enumerator::operator*(&local_38);
        iVar2 = Enumerator::operator*(&local_48);
        if (iVar1 < 0x588 && iVar2 < 0x588) {
          if (toLowercaseU8[(long)iVar1 * 2] != toLowercaseU8[(long)iVar2 * 2]) {
            return false;
          }
          if (toLowercaseU8[(long)(iVar1 * 2) + 1] != toLowercaseU8[(long)(iVar2 * 2) + 1]) {
            return false;
          }
        }
        else if (iVar1 != iVar2) {
          return false;
        }
        local_48.u = local_48.u + local_48.n;
        bVar3 = local_38.u[local_38.n] == '\0';
        if (bVar3) goto LAB_0011aa69;
        local_38.u = (char *)((long)local_38.u + (long)local_38.n);
      } while (*local_48.u != '\0');
    }
    if (!bVar3) {
      if (*local_48.u == '\0') {
        return false;
      }
      if (!bVar3) {
        return true;
      }
    }
  }
LAB_0011aa69:
  if (*local_48.u != '\0') {
    return false;
  }
  return true;
}

Assistant:

const char* str() const {return (_size==0)? (const char*)_space : (const char*)_str;}